

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicseffect.cpp
# Opt level: O0

void __thiscall QGraphicsColorizeEffect::setStrength(QGraphicsColorizeEffect *this,qreal strength)

{
  bool bVar1;
  QGraphicsColorizeEffectPrivate *pQVar2;
  QGraphicsEffect *in_RDI;
  double unaff_retaddr;
  double in_stack_00000008;
  QGraphicsColorizeEffectPrivate *d;
  qreal in_stack_ffffffffffffffd8;
  QGraphicsEffect *strength_00;
  
  strength_00 = in_RDI;
  pQVar2 = d_func((QGraphicsColorizeEffect *)0x4a4132);
  QPixmapColorizeFilter::strength((QPixmapColorizeFilter *)in_RDI);
  bVar1 = qFuzzyCompare(in_stack_00000008,unaff_retaddr);
  if (!bVar1) {
    QPixmapColorizeFilter::setStrength((QPixmapColorizeFilter *)in_RDI,(qreal)strength_00);
    bVar1 = qFuzzyIsNull(in_stack_ffffffffffffffd8);
    *(uint *)&pQVar2->field_0xb0 =
         *(uint *)&pQVar2->field_0xb0 & 0xfffffffe | (uint)((bVar1 ^ 0xffU) & 1);
    QGraphicsEffect::update(in_RDI);
    strengthChanged((QGraphicsColorizeEffect *)0x4a41b7,in_stack_ffffffffffffffd8);
  }
  return;
}

Assistant:

void QGraphicsColorizeEffect::setStrength(qreal strength)
{
    Q_D(QGraphicsColorizeEffect);
    if (qFuzzyCompare(d->filter->strength(), strength))
        return;

    d->filter->setStrength(strength);
    d->opaque = !qFuzzyIsNull(strength);
    update();
    emit strengthChanged(strength);
}